

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O1

void nk_end(nk_context *ctx)

{
  nk_command_buffer *b;
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  uint uVar8;
  nk_panel_type nVar9;
  int iVar10;
  nk_window *pnVar11;
  nk_panel *pnVar12;
  nk_window *pnVar13;
  nk_user_font *font;
  _func_void_nk_command_buffer_ptr_nk_handle *p_Var14;
  undefined1 auVar15 [16];
  nk_vec2 nVar16;
  bool bVar17;
  nk_panel *pnVar18;
  nk_bool nVar19;
  nk_panel *pnVar20;
  uint *puVar21;
  long lVar22;
  nk_panel *pnVar23;
  nk_page_element *pe;
  nk_window *pnVar24;
  nk_context *in;
  nk_property_state *__s;
  nk_edit_state *__s_00;
  ulong uVar25;
  ulong uVar26;
  bool bVar27;
  float fVar28;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  nk_rect r;
  nk_rect rect;
  nk_rect rect_00;
  nk_rect rect_01;
  nk_rect rect_02;
  nk_rect scroll;
  nk_rect bounds;
  nk_rect bounds_00;
  nk_rect rect_03;
  nk_rect r_00;
  nk_flags state;
  nk_rect empty_east;
  nk_flags local_fc;
  nk_rect local_f8;
  nk_vec2 local_e8;
  undefined8 uStack_e0;
  undefined1 local_d8 [16];
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  nk_rect local_88;
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  undefined1 local_68 [16];
  nk_rect local_50;
  nk_rect local_40;
  
  if (ctx == (nk_context *)0x0) {
    return;
  }
  pnVar11 = ctx->current;
  if (pnVar11 == (nk_window *)0x0) {
    return;
  }
  pnVar12 = pnVar11->layout;
  if ((pnVar12 == (nk_panel *)0x0) ||
     ((pnVar12->type == NK_PANEL_WINDOW && ((pnVar11->flags & 0x2000) != 0)))) goto LAB_0011ae83;
  b = &pnVar11->buffer;
  in = (nk_context *)0x0;
  if ((pnVar12->flags & 0x1400) == 0) {
    in = ctx;
  }
  if ((pnVar12->type &
      (NK_PANEL_TOOLTIP|NK_PANEL_MENU|NK_PANEL_COMBO|NK_PANEL_CONTEXTUAL|NK_PANEL_POPUP|
      NK_PANEL_GROUP)) == NK_PANEL_NONE) {
    r.w = 16384.0;
    r.h = 16384.0;
    r.x = -8192.0;
    r.y = -8192.0;
    nk_push_scissor(b,r);
  }
  local_e8 = (ctx->style).window.scrollbar_size;
  uStack_e0 = 0;
  nVar16 = nk_panel_get_padding(&ctx->style,pnVar12->type);
  auVar15._8_4_ = extraout_XMM0_Dc;
  auVar15._0_4_ = nVar16.x;
  auVar15._4_4_ = nVar16.y;
  auVar15._12_4_ = extraout_XMM0_Dd;
  fVar28 = (pnVar12->row).height + pnVar12->at_y;
  pnVar12->at_y = fVar28;
  local_d8 = auVar15;
  if ((pnVar12->flags & 0x8800) == 0x800) {
    fVar29 = (pnVar12->bounds).y;
    if (fVar28 < (pnVar12->bounds).h + fVar29) {
      (pnVar12->bounds).h = fVar28 - fVar29;
    }
    local_d8._4_4_ = nVar16.y;
    rect.y = fVar29;
    rect.x = (pnVar11->bounds).x;
    rect.h = (float)local_d8._4_4_;
    rect.w = (pnVar11->bounds).w;
    nk_fill_rect(b,rect,0.0,(ctx->style).window.background);
    rect_00.w = pnVar12->border + (float)local_d8._0_4_;
    rect_00.y = (pnVar12->bounds).y;
    rect_00.x = (pnVar11->bounds).x;
    rect_00.h = (pnVar12->bounds).h;
    nk_fill_rect(b,rect_00,0.0,(ctx->style).window.background);
    rect_01.x = (pnVar12->bounds).x + (pnVar12->bounds).w;
    fVar28 = pnVar12->border + (float)local_d8._0_4_;
    if ((*pnVar12->offset_y == 0) && ((pnVar12->flags & 0x20) == 0)) {
      fVar28 = fVar28 + local_e8.x;
    }
    rect_01.y = (pnVar12->bounds).y;
    rect_01.h = (pnVar12->bounds).h;
    rect_01.w = fVar28;
    nk_fill_rect(b,rect_01,0.0,(ctx->style).window.background);
    if (0.0 < pnVar12->footer_height) {
      rect_02.y = (pnVar12->bounds).y + (pnVar12->bounds).h;
      rect_02.x = (pnVar11->bounds).x;
      rect_02.h = pnVar12->footer_height;
      rect_02.w = (pnVar11->bounds).w;
      nk_fill_rect(b,rect_02,0.0,(ctx->style).window.background);
    }
  }
  if (((pnVar12->flags & 0x8020) == 0) &&
     (pnVar11->scrollbar_hiding_timer <= 4.0 && pnVar11->scrollbar_hiding_timer != 4.0)) {
    if ((pnVar12->type &
        (NK_PANEL_TOOLTIP|NK_PANEL_MENU|NK_PANEL_COMBO|NK_PANEL_CONTEXTUAL|NK_PANEL_POPUP|
        NK_PANEL_GROUP)) == NK_PANEL_NONE) {
      if (pnVar11 == ctx->active) {
        bVar27 = pnVar12->has_scrolling != 0;
      }
      else {
        bVar27 = false;
      }
      if (in != (nk_context *)0x0) {
        bVar17 = bVar27;
        if ((in->input).mouse.scroll_delta.y <= 0.0) {
          bVar17 = (bool)(0.0 < (in->input).mouse.scroll_delta.x & bVar27);
        }
        if (bVar17 != false) {
          pnVar11->scrolled = 1;
          goto LAB_0011a4c0;
        }
      }
      pnVar11->scrolled = 0;
    }
    else {
      pnVar20 = pnVar11->layout;
      pnVar18 = pnVar20;
      do {
        pnVar23 = pnVar18;
        pnVar18 = pnVar23->parent;
        pnVar13 = pnVar11;
      } while (pnVar23->parent != (nk_panel *)0x0);
      do {
        pnVar24 = pnVar13;
        pnVar13 = pnVar24->parent;
      } while (pnVar13 != (nk_window *)0x0);
      if (((pnVar24 != ctx->active) || (pnVar12->has_scrolling == 0)) || (in == (nk_context *)0x0))
      goto LAB_0011a376;
      uVar1 = (pnVar12->bounds).x;
      uVar5 = (pnVar12->bounds).y;
      fVar28 = (in->input).mouse.pos.x;
      bVar27 = false;
      if (((float)uVar1 <= fVar28) &&
         (uVar2 = (pnVar12->bounds).w, uVar6 = (pnVar12->bounds).h,
         fVar28 < (float)uVar1 + (float)uVar2)) {
        fVar28 = (in->input).mouse.pos.y;
        bVar27 = false;
        if (((float)uVar5 <= fVar28) && (fVar28 < (float)uVar5 + (float)uVar6)) {
          fVar28 = (pnVar23->clip).x;
          fVar29 = (pnVar12->bounds).x;
          if ((fVar28 < (pnVar12->bounds).w + fVar29) && (fVar29 < fVar28 + (pnVar23->clip).w)) {
            fVar28 = (pnVar23->clip).y;
            fVar29 = (pnVar12->bounds).y;
            if ((fVar28 < (pnVar12->bounds).h + fVar29) && (fVar29 < fVar28 + (pnVar23->clip).h)) {
              for (; pnVar20->parent != (nk_panel *)0x0; pnVar20 = pnVar20->parent) {
                pnVar20->has_scrolling = 0;
              }
              pnVar20->has_scrolling = 0;
              bVar27 = true;
              goto LAB_0011a4c0;
            }
          }
LAB_0011a376:
          bVar27 = false;
        }
      }
    }
LAB_0011a4c0:
    local_f8.x = 0.0;
    fVar28 = (pnVar12->bounds).y;
    scroll.x = (pnVar12->bounds).x + (pnVar12->bounds).w + (float)local_d8._0_4_;
    fVar29 = (pnVar12->bounds).h;
    scroll.y = fVar28;
    scroll.h = fVar29;
    scroll.w = local_e8.x;
    fVar28 = nk_do_scrollbarv((nk_flags *)&local_f8,b,scroll,(uint)bVar27,(float)*pnVar12->offset_y,
                              (float)(int)(pnVar12->at_y - fVar28),fVar29 * 0.1,fVar29 * 0.01,
                              &(ctx->style).scrollv,&in->input,(ctx->style).font);
    *pnVar12->offset_y = (nk_uint)(long)fVar28;
    if ((in != (nk_context *)0x0) && (bVar27 != false)) {
      (in->input).mouse.scroll_delta.y = 0.0;
    }
    local_fc = 0;
    local_f8.x = (pnVar12->bounds).x;
    local_f8.y = (pnVar12->bounds).y + (pnVar12->bounds).h;
    fVar28 = pnVar12->max_x;
    fVar29 = (pnVar12->bounds).w;
    fVar31 = (float)(int)(fVar28 - local_f8.x);
    font = (ctx->style).font;
    local_f8.h = 1.0;
    if (1.0 <= local_e8.y) {
      local_f8.h = local_e8.y;
    }
    fVar33 = local_f8.h + local_f8.h;
    local_f8.w = fVar33;
    if (fVar33 <= fVar29) {
      local_f8.w = fVar29;
    }
    fVar29 = 0.0;
    if (local_f8.w < fVar31) {
      fVar29 = (float)*pnVar12->offset_x;
      fVar30 = fVar28 * 0.05;
      local_98 = ZEXT416((uint)fVar31);
      local_50.h = local_f8.h;
      if ((ctx->style).scrollh.show_buttons != 0) {
        local_a8 = ZEXT416((uint)fVar33);
        local_68 = ZEXT416((uint)local_f8.w);
        fVar31 = fVar30;
        if (fVar28 * 0.005 <= fVar30) {
          fVar31 = fVar28 * 0.005;
        }
        local_c8 = CONCAT44(local_f8.y,local_f8.x);
        local_b8 = ZEXT416((uint)local_f8.h);
        uStack_c0 = 0;
        bounds.h = local_f8.h;
        bounds.w = local_f8.h;
        bounds.x = local_f8.x;
        bounds.y = local_f8.y;
        local_78 = local_f8.h;
        fStack_74 = local_f8.h;
        fStack_70 = local_f8.h;
        fStack_6c = local_f8.h;
        nVar19 = nk_do_button_symbol((nk_flags *)&local_88,b,bounds,(ctx->style).scrollh.dec_symbol,
                                     NK_BUTTON_REPEATER,&(ctx->style).scrollh.dec_button,&in->input,
                                     font);
        fVar28 = 0.0;
        if (nVar19 != 0) {
          fVar28 = fVar31;
        }
        local_a8._4_4_ = local_68._4_4_;
        local_a8._0_4_ = (float)local_68._0_4_ - (float)local_a8._0_4_;
        local_a8._8_4_ = local_68._8_4_;
        local_a8._12_4_ = local_68._12_4_;
        fVar29 = fVar29 - fVar28;
        bounds_00.h = fStack_74;
        bounds_00.w = local_78;
        bounds_00.y = (float)local_c8._4_4_;
        bounds_00.x = ((float)local_68._0_4_ + (float)local_c8) - (float)local_b8._0_4_;
        nVar19 = nk_do_button_symbol((nk_flags *)&local_88,b,bounds_00,
                                     (ctx->style).scrollh.inc_symbol,NK_BUTTON_REPEATER,
                                     &(ctx->style).scrollh.inc_button,&in->input,font);
        if (nVar19 != 0) {
          fVar29 = fVar29 + fVar31;
        }
        local_f8.x = (float)local_c8 + (float)local_b8._0_4_;
        local_f8.w = (float)local_a8._0_4_;
        fVar31 = (float)local_98._0_4_;
        local_50.h = (float)local_b8._0_4_;
      }
      if (local_f8.w <= fVar30) {
        fVar30 = local_f8.w;
      }
      if (fVar31 - local_f8.w <= fVar29) {
        fVar29 = fVar31 - local_f8.w;
      }
      fVar28 = 0.0;
      if (0.0 <= fVar29) {
        fVar28 = fVar29;
      }
      fVar29 = (ctx->style).scrollh.border;
      nVar16 = (ctx->style).scrollh.padding;
      fVar33 = nVar16.x;
      fVar32 = nVar16.y;
      local_88.x = (fVar28 / fVar31) * local_f8.w + local_f8.x + fVar29 + fVar33;
      local_88.y = local_f8.y + fVar29 + fVar32;
      local_c8 = CONCAT44(local_c8._4_4_,local_f8.w);
      local_88.w = (local_f8.w / fVar31) * local_f8.w - (fVar33 + fVar33 + fVar29 + fVar29);
      local_88.h = local_50.h - (fVar32 + fVar32 + fVar29 + fVar29);
      local_b8._0_4_ = local_f8.x;
      local_40.x = local_f8.x;
      local_40.y = local_f8.y;
      local_50.x = local_88.w + local_88.x;
      local_40.w = local_88.x - local_f8.x;
      local_50.y = local_f8.y;
      local_50.w = (local_f8.w + local_f8.x) - local_50.x;
      local_40.h = local_50.h;
      fVar29 = nk_scrollbar_behavior
                         (&local_fc,&in->input,(uint)bVar27,&local_f8,&local_88,&local_40,&local_50,
                          fVar28,fVar31,fVar30,NK_HORIZONTAL);
      local_88.x = (fVar29 / (float)local_98._0_4_) * (float)local_c8 + (float)local_b8._0_4_;
      p_Var14 = (ctx->style).scrollh.draw_begin;
      if (p_Var14 != (_func_void_nk_command_buffer_ptr_nk_handle *)0x0) {
        (*p_Var14)(b,(ctx->style).scrollh.userdata);
      }
      nk_draw_scrollbar(b,local_fc,&(ctx->style).scrollh,&local_f8,&local_88);
      p_Var14 = (ctx->style).scrollh.draw_end;
      if (p_Var14 != (_func_void_nk_command_buffer_ptr_nk_handle *)0x0) {
        (*p_Var14)(b,(ctx->style).scrollh.userdata);
      }
    }
    *pnVar12->offset_x = (nk_uint)(long)fVar29;
  }
  if ((pnVar11->flags & 0x80) == 0) {
LAB_0011a943:
    pnVar11->scrollbar_hiding_timer = 0.0;
  }
  else {
    fVar28 = (ctx->input).mouse.delta.x;
    if ((((fVar28 != 0.0) || (NAN(fVar28))) || (fVar28 = (ctx->input).mouse.delta.y, fVar28 != 0.0))
       || (NAN(fVar28))) {
      bVar27 = false;
    }
    else {
      bVar27 = (ctx->input).mouse.scroll_delta.y == 0.0;
    }
    nVar19 = nk_window_is_hovered(ctx);
    if ((!(bool)(bVar27 & nVar19 != 0)) && (nVar19 != 0 || (ctx->last_widget_state & 2) != 0))
    goto LAB_0011a943;
    pnVar11->scrollbar_hiding_timer = ctx->delta_time_seconds + pnVar11->scrollbar_hiding_timer;
  }
  uVar8 = pnVar12->flags;
  if ((uVar8 & 1) != 0) {
    nVar9 = pnVar12->type;
    lVar22 = 0x1e2c;
    if ((int)nVar9 < 0x20) {
      if (nVar9 == NK_PANEL_GROUP) {
        lVar22 = 0x1e40;
      }
      else if (nVar9 == NK_PANEL_POPUP) {
        lVar22 = 0x1e30;
      }
      else if (nVar9 == NK_PANEL_CONTEXTUAL) {
        lVar22 = 0x1e38;
      }
    }
    else if (nVar9 == NK_PANEL_COMBO) {
      lVar22 = 0x1e34;
    }
    else if ((nVar9 == NK_PANEL_MENU) || (nVar9 == NK_PANEL_TOOLTIP)) {
      lVar22 = 0x1e3c;
    }
    if ((short)uVar8 < 0) {
      fVar28 = (ctx->style).window.border + (pnVar11->bounds).y + pnVar12->header_height;
    }
    else if ((uVar8 >> 0xb & 1) == 0) {
      fVar28 = (pnVar11->bounds).y + (pnVar11->bounds).h;
    }
    else {
      fVar28 = (pnVar12->bounds).y + (pnVar12->bounds).h + pnVar12->footer_height;
    }
    uVar3 = (pnVar11->bounds).x;
    uVar7 = (pnVar11->bounds).y;
    rect_03.y = (float)uVar7;
    rect_03.x = (float)uVar3;
    uVar4 = (pnVar11->bounds).w;
    rect_03.h = fVar28 - (pnVar11->bounds).y;
    rect_03.w = (float)uVar4;
    nk_stroke_rect(b,rect_03,0.0,pnVar12->border,
                   *(nk_color *)((long)&(ctx->input).keyboard.keys[0].down + lVar22));
  }
  if ((in != (nk_context *)0x0) && (uVar8 = pnVar12->flags, (uVar8 & 0x8004) == 4)) {
    fVar28 = (pnVar12->bounds).x;
    fVar29 = (pnVar12->bounds).y + (pnVar12->bounds).h;
    if ((uVar8 >> 9 & 1) == 0) {
      local_d8._0_4_ = fVar28 + (pnVar12->bounds).w + (float)local_d8._0_4_;
    }
    else {
      local_d8._0_4_ = fVar28 + (float)local_d8._0_4_ * -0.5;
    }
    if ((uVar8 & 0x20) != 0) {
      local_d8._0_4_ = (float)local_d8._0_4_ - local_e8.x;
    }
    local_d8._4_4_ = fVar29;
    local_d8._8_8_ = 0;
    if ((ctx->style).window.scaler.type == NK_STYLE_ITEM_IMAGE) {
      r_00.y = fVar29;
      r_00.x = (float)local_d8._0_4_;
      r_00.w = local_e8.x;
      r_00.h = local_e8.y;
      nk_draw_image(b,r_00,&(ctx->style).window.scaler.data.image,(nk_color)0xffffffff);
    }
    else {
      fVar31 = local_e8.x + (float)local_d8._0_4_;
      fVar28 = (float)local_d8._0_4_;
      if ((uVar8 >> 9 & 1) == 0) {
        fVar28 = fVar31;
        fVar31 = (float)local_d8._0_4_;
      }
      nk_fill_triangle(b,fVar28,fVar29,fVar28,local_e8.y + fVar29,fVar31,local_e8.y + fVar29,
                       (ctx->style).window.scaler.data.color);
    }
    if ((pnVar11->flags & 0x1000) == 0) {
      iVar10 = (in->input).mouse.buttons[0].down;
      fVar28 = (in->input).mouse.buttons[0].clicked_pos.x;
      bVar27 = false;
      if (((float)local_d8._0_4_ <= fVar28) &&
         (bVar27 = false, fVar28 < local_e8.x + (float)local_d8._0_4_)) {
        fVar28 = (in->input).mouse.buttons[0].clicked_pos.y;
        bVar27 = iVar10 == 1 &&
                 (fVar28 < local_e8.y + (float)local_d8._4_4_ && (float)local_d8._4_4_ <= fVar28);
      }
      if ((iVar10 != 0) && (bVar27)) {
        fVar28 = (ctx->style).window.min_size.x;
        fVar29 = (ctx->style).window.min_size.y;
        fVar31 = (in->input).mouse.delta.x;
        uVar8 = pnVar12->flags;
        fVar33 = fVar31;
        if ((uVar8 >> 9 & 1) != 0) {
          fVar33 = -fVar31;
          (pnVar11->bounds).x = (pnVar11->bounds).x + fVar31;
        }
        fVar32 = (pnVar11->bounds).w + fVar33;
        fVar30 = (float)local_d8._0_4_;
        if ((fVar28 <= fVar32) &&
           ((fVar33 < 0.0 || ((0.0 < fVar33 && ((float)local_d8._0_4_ <= (in->input).mouse.pos.x))))
           )) {
          (pnVar11->bounds).w = fVar32;
          fVar30 = fVar31 + (float)local_d8._0_4_;
        }
        fVar28 = (float)local_d8._4_4_;
        if ((uVar8 >> 0xb & 1) == 0) {
          fVar31 = (in->input).mouse.delta.y;
          fVar33 = (pnVar11->bounds).h + fVar31;
          if ((fVar29 < fVar33) &&
             ((fVar31 < 0.0 ||
              ((0.0 < fVar31 && ((float)local_d8._4_4_ <= (in->input).mouse.pos.y)))))) {
            (pnVar11->bounds).h = fVar33;
            fVar28 = (float)local_d8._4_4_ + fVar31;
          }
        }
        (ctx->style).cursor_active = (ctx->style).cursors[6];
        nVar16.y = local_e8.y * 0.5 + fVar28;
        nVar16.x = local_e8.x * 0.5 + fVar30;
        (in->input).mouse.buttons[0].clicked_pos = nVar16;
      }
    }
  }
  if ((pnVar12->type &
      (NK_PANEL_TOOLTIP|NK_PANEL_MENU|NK_PANEL_COMBO|NK_PANEL_CONTEXTUAL|NK_PANEL_POPUP|
      NK_PANEL_GROUP)) == NK_PANEL_NONE) {
    if ((pnVar12->flags & 0x2000) == 0) {
      (pnVar11->buffer).end = (ctx->memory).allocated;
      if ((pnVar11->popup).buf.active != 0) {
        *(nk_size *)((long)(ctx->memory).memory.ptr + (pnVar11->popup).buf.parent + 8) =
             (pnVar11->popup).buf.end;
      }
    }
    else {
      (pnVar11->buffer).begin = 0;
      (pnVar11->buffer).end = 0;
      (pnVar11->buffer).last = 0;
      (pnVar11->buffer).clip = nk_null_rect;
    }
  }
  if ((pnVar12->flags >> 0x10 & 1) != 0) {
    pnVar12->flags = pnVar12->flags & 0xfffeefff;
  }
  pnVar11->flags = pnVar12->flags;
  iVar10 = (pnVar11->property).active;
  if (((iVar10 == 0) || ((pnVar11->property).old == (pnVar11->property).seq)) ||
     (iVar10 != (pnVar11->property).prev)) {
    (pnVar11->property).old = (pnVar11->property).seq;
    (pnVar11->property).prev = iVar10;
    (pnVar11->property).seq = 0;
  }
  else {
    __s = &pnVar11->property;
    uVar25 = (ulong)__s & 3;
    if (uVar25 == 0) {
      uVar26 = 0x68;
    }
    else {
      memset(__s,0,4 - uVar25);
      uVar26 = uVar25 | 100;
      __s = (nk_property_state *)((long)__s + (4 - uVar25));
    }
    uVar25 = (ulong)((uint)uVar26 & 0xfffffffc);
    memset(__s,0,uVar25);
    if ((uVar26 & 3) != 0) {
      memset(__s->buffer + (uVar25 - 8),0,uVar26 & 3);
    }
  }
  iVar10 = (pnVar11->edit).active;
  if (((iVar10 == 0) || ((pnVar11->edit).old == (pnVar11->edit).seq)) ||
     (iVar10 != (pnVar11->edit).prev)) {
    (pnVar11->edit).old = (pnVar11->edit).seq;
    (pnVar11->edit).prev = iVar10;
    (pnVar11->edit).seq = 0;
  }
  else {
    __s_00 = &pnVar11->edit;
    uVar25 = (ulong)__s_00 & 3;
    if (uVar25 == 0) {
      uVar26 = 0x2c;
    }
    else {
      memset(__s_00,0,4 - uVar25);
      uVar26 = uVar25 | 0x28;
      __s_00 = (nk_edit_state *)((long)__s_00 + (4 - uVar25));
    }
    uVar25 = (ulong)((uint)uVar26 & 0xfffffffc);
    memset(__s_00,0,uVar25);
    if ((uVar26 & 3) != 0) {
      memset((void *)((long)&__s_00->name + uVar25),0,uVar26 & 3);
    }
  }
  if (((pnVar11->popup).active_con == 0) || ((pnVar11->popup).con_old == (pnVar11->popup).con_count)
     ) {
    puVar21 = &(pnVar11->popup).con_count;
    (pnVar11->popup).con_old = (pnVar11->popup).con_count;
  }
  else {
    puVar21 = &(pnVar11->popup).active_con;
    (pnVar11->popup).con_count = 0;
    (pnVar11->popup).con_old = 0;
  }
  *puVar21 = 0;
  (pnVar11->popup).combo_count = 0;
  nk_free_page_element(ctx,(nk_page_element *)ctx->current->layout);
LAB_0011ae83:
  ctx->current = (nk_window *)0x0;
  return;
}

Assistant:

NK_API void
nk_end(struct nk_context *ctx)
{
struct nk_panel *layout;
NK_ASSERT(ctx);
NK_ASSERT(ctx->current && "if this triggers you forgot to call `nk_begin`");
if (!ctx || !ctx->current)
return;

layout = ctx->current->layout;
if (!layout || (layout->type == NK_PANEL_WINDOW && (ctx->current->flags & NK_WINDOW_HIDDEN))) {
ctx->current = 0;
return;
}
nk_panel_end(ctx);
nk_free_panel(ctx, ctx->current->layout);
ctx->current = 0;
}